

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O3

double __thiscall BindRnase::CalculatePropensity(BindRnase *this)

{
  double dVar1;
  int iVar2;
  SpeciesTracker *this_00;
  double dVar3;
  
  if ((this->super_Bind).super_Reaction.remove_ == true) {
    (this->super_Bind).super_Reaction.old_prop_ = 0.0;
  }
  this_00 = SpeciesTracker::Instance();
  dVar3 = (this->super_Bind).rate_constant_;
  iVar2 = SpeciesTracker::species(this_00,&(this->super_Bind).promoter_name_);
  dVar3 = (double)iVar2 * dVar3;
  dVar1 = (this->super_Bind).super_Reaction.old_prop_;
  (this->super_Bind).super_Reaction.old_prop_ = dVar3;
  return dVar3 - dVar1;
}

Assistant:

double BindRnase::CalculatePropensity() {
  if (remove_ == true) {
    old_prop_ = 0;
  }
  auto &tracker = SpeciesTracker::Instance();
  double new_prop = rate_constant_ * tracker.species(promoter_name_);
  double prop_diff = new_prop - old_prop_;
  old_prop_ = new_prop;
  return prop_diff;
}